

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  char *key_00;
  char *str_00;
  ulong in_RDX;
  void *in_RSI;
  bool bVar1;
  uint string2_begin;
  uint length;
  char *str;
  char *key;
  uint error;
  ulong local_48;
  uint local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  uint uVar3;
  
  uVar2 = 0;
  local_34 = 0;
  while( true ) {
    bVar1 = false;
    if (local_34 < in_RDX) {
      bVar1 = *(char *)((long)in_RSI + (ulong)local_34) != '\0';
    }
    if (!bVar1) break;
    local_34 = local_34 + 1;
  }
  if ((local_34 == 0) || (0x4f < local_34)) {
    uVar3 = 0x59;
  }
  else {
    key_00 = (char *)lodepng_malloc(0x1c5234);
    if (key_00 == (char *)0x0) {
      uVar3 = 0x53;
    }
    else {
      lodepng_memcpy(key_00,in_RSI,(ulong)local_34);
      key_00[local_34] = '\0';
      local_34 = local_34 + 1;
      if (in_RDX < local_34) {
        local_48 = 0;
      }
      else {
        local_48 = in_RDX - local_34;
      }
      str_00 = (char *)lodepng_malloc(0x1c52b9);
      if (str_00 == (char *)0x0) {
        uVar3 = 0x53;
      }
      else {
        lodepng_memcpy(str_00,(void *)((long)in_RSI + (ulong)local_34),local_48 & 0xffffffff);
        str_00[local_48 & 0xffffffff] = '\0';
        uVar3 = lodepng_add_text((LodePNGInfo *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),key_00,
                                 str_00);
      }
    }
  }
  lodepng_free((void *)0x1c531b);
  lodepng_free((void *)0x1c5325);
  return uVar3;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(str, data + string2_begin, length);
    str[length] = 0;

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}